

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O1

void __thiscall
icu_63::Decomposer::rangeHandler(Decomposer *this,UChar32 start,UChar32 end,Norm *norm)

{
  byte bVar1;
  ushort uVar2;
  short sVar3;
  char16_t cVar4;
  MappingType MVar5;
  Norms *pNVar6;
  Norm *pNVar7;
  UnicodeString *pUVar8;
  uint32_t uVar9;
  uint uVar10;
  UChar32 c;
  int iVar11;
  long lVar12;
  UnicodeString *pUVar13;
  undefined8 extraout_RAX;
  uint uVar14;
  int32_t iVar15;
  ulong uVar16;
  int offset;
  char16_t *pcVar17;
  Decomposer *this_00;
  uint uVar18;
  Decomposer *pDVar19;
  int srcLength;
  int32_t iVar20;
  Norm *pNVar21;
  UChar buffer [3];
  UChar local_7e;
  short local_7c;
  short local_7a;
  UnicodeString *local_78;
  Decomposer *local_70;
  Norm *local_68;
  UnicodeString *local_60;
  int local_54;
  Norm *local_50;
  UChar *local_48;
  char16_t *local_38;
  
  if (1 < (int)norm->mappingType) {
    local_78 = norm->mapping;
    uVar2 = (local_78->fUnion).fStackFields.fLengthAndFlags;
    if ((uVar2 & 0x11) == 0) {
      if ((uVar2 & 2) == 0) {
        pcVar17 = (local_78->fUnion).fFields.fArray;
      }
      else {
        pcVar17 = (char16_t *)((long)&local_78->fUnion + 2);
      }
    }
    else {
      pcVar17 = (char16_t *)0x0;
    }
    sVar3 = (local_78->fUnion).fStackFields.fLengthAndFlags;
    if (sVar3 < 0) {
      iVar20 = (local_78->fUnion).fFields.fLength;
    }
    else {
      iVar20 = (int)sVar3 >> 5;
    }
    pUVar13 = (UnicodeString *)0x0;
    local_70 = this;
    local_68 = norm;
    local_54 = end;
    local_38 = pcVar17;
    srcLength = 0;
    if (0 < iVar20) {
      do {
        offset = srcLength + 1;
        cVar4 = pcVar17[srcLength];
        this_00 = (Decomposer *)(ulong)(ushort)cVar4;
        if ((((cVar4 & 0xfc00U) == 0xd800) && (offset != iVar20)) &&
           (lVar12 = (long)offset, ((ushort)pcVar17[lVar12] & 0xfc00) == 0xdc00)) {
          offset = srcLength + 2;
          this_00 = (Decomposer *)
                    (ulong)((uint)(ushort)cVar4 * 0x400 + (uint)(ushort)pcVar17[lVar12] + 0xfca02400
                           );
        }
        iVar11 = (int)this_00;
        local_60 = pUVar13;
        if (iVar11 <= local_54 && start <= iVar11) {
          rangeHandler(this_00);
LAB_001e056e:
          fprintf(_stderr,
                  "gennorm2 error: U+%04lX\'s round-trip mapping\'s starter U+%04lX decomposes and the inner/earlier tccc=%hu > outer/following tccc=%hu, not possible in Unicode normalization\n"
                  ,(long)start,(long)iVar11);
          exit(3);
        }
        pNVar6 = (local_70->super_Enumerator).norms;
        pNVar21 = pNVar6->norms;
        pDVar19 = this_00;
        uVar9 = umutablecptrie_get_63(pNVar6->normTrie,iVar11);
        pUVar13 = local_60;
        MVar5 = pNVar21[uVar9].mappingType;
        if ((int)MVar5 < 2) {
          uVar10 = iVar11 - 0xac00;
          if (uVar10 < 0x2ba4) {
            uVar14 = uVar10 >> 2;
            uVar16 = (ulong)uVar14 / 7;
            uVar18 = uVar10 / 0x24c | 0x1100;
            local_7e = (UChar)uVar18;
            local_7c = ((short)((ulong)uVar14 * 0x24924925 >> 0x20) -
                       ((short)(uVar16 / 0x15) + (short)(uVar16 / 0x15) * 0x14)) + 0x1161;
            iVar11 = uVar10 + (uVar14 / 7) * -0x1c;
            if (iVar11 == 0) {
              iVar15 = 2;
            }
            else {
              local_7a = (short)iVar11 + 0x11a7;
              iVar15 = 3;
            }
            if ((srcLength != 0) && (local_68->mappingType == ROUND_TRIP)) {
              rangeHandler();
LAB_001e05a6:
              rangeHandler();
LAB_001e05b1:
              pDVar19 = this_00;
              rangeHandler();
              UMemory::operator_delete((UMemory *)this_00,pDVar19);
              _Unwind_Resume(extraout_RAX);
            }
            if (local_60 == (UnicodeString *)0x0) {
              pUVar13 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(ulong)uVar18);
              UnicodeString::UnicodeString(pUVar13,local_78,0,srcLength);
            }
            UnicodeString::doAppend(pUVar13,&local_7e,0,iVar15);
            local_48 = &local_7e;
          }
          else if (local_60 == (UnicodeString *)0x0) {
            pUVar13 = (UnicodeString *)0x0;
          }
          else {
            UnicodeString::doAppend(local_60,local_78,srcLength,offset - srcLength);
          }
        }
        else {
          pNVar21 = pNVar21 + uVar9;
          if (local_68->mappingType == ROUND_TRIP) {
            if (srcLength != 0) goto LAB_001e05a6;
            if (MVar5 != ROUND_TRIP) goto LAB_001e05b1;
            pNVar6 = (local_70->super_Enumerator).norms;
            c = UnicodeString::char32At(local_78,offset);
            pNVar7 = pNVar6->norms;
            uVar9 = umutablecptrie_get_63(pNVar6->normTrie,c);
            pUVar13 = pNVar21->mapping;
            sVar3 = (pUVar13->fUnion).fStackFields.fLengthAndFlags;
            if (sVar3 < 0) {
              iVar15 = (pUVar13->fUnion).fFields.fLength;
            }
            else {
              iVar15 = (int)sVar3 >> 5;
            }
            bVar1 = pNVar7[uVar9].cc;
            uVar10 = UnicodeString::char32At(pUVar13,iVar15 + -1);
            pNVar6 = (local_70->super_Enumerator).norms;
            local_50 = pNVar6->norms;
            pDVar19 = (Decomposer *)(ulong)uVar10;
            uVar9 = umutablecptrie_get_63(pNVar6->normTrie,uVar10);
            if (bVar1 < local_50[uVar9].cc) goto LAB_001e056e;
          }
          pUVar13 = local_60;
          if (local_60 == (UnicodeString *)0x0) {
            pUVar13 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pDVar19);
            UnicodeString::UnicodeString(pUVar13,local_78,0,srcLength);
          }
          pUVar8 = pNVar21->mapping;
          sVar3 = (pUVar8->fUnion).fStackFields.fLengthAndFlags;
          if (sVar3 < 0) {
            iVar15 = (pUVar8->fUnion).fFields.fLength;
          }
          else {
            iVar15 = (int)sVar3 >> 5;
          }
          UnicodeString::doAppend(pUVar13,pUVar8,0,iVar15);
        }
        srcLength = offset;
      } while (offset < iVar20);
    }
    pNVar21 = local_68;
    if (pUVar13 != (UnicodeString *)0x0) {
      pUVar8 = local_68->mapping;
      if (local_68->rawMapping == (UnicodeString *)0x0) {
        local_68->rawMapping = pUVar8;
      }
      else if (pUVar8 != (UnicodeString *)0x0) {
        (*(pUVar8->super_Replaceable).super_UObject._vptr_UObject[1])();
      }
      pNVar21->mapping = pUVar13;
      local_70->didDecompose = local_70->didDecompose | 1;
    }
  }
  return;
}

Assistant:

void Decomposer::rangeHandler(UChar32 start, UChar32 end, Norm &norm) {
    if(!norm.hasMapping()) { return; }
    const UnicodeString &m=*norm.mapping;
    UnicodeString *decomposed=nullptr;
    const UChar *s=toUCharPtr(m.getBuffer());
    int32_t length=m.length();
    int32_t prev, i=0;
    UChar32 c;
    while(i<length) {
        prev=i;
        U16_NEXT(s, i, length, c);
        if(start<=c && c<=end) {
            fprintf(stderr,
                    "gennorm2 error: U+%04lX maps to itself directly or indirectly\n",
                    (long)c);
            exit(U_INVALID_FORMAT_ERROR);
        }
        const Norm &cNorm=norms.getNormRef(c);
        if(cNorm.hasMapping()) {
            if(norm.mappingType==Norm::ROUND_TRIP) {
                if(prev==0) {
                    if(cNorm.mappingType!=Norm::ROUND_TRIP) {
                        fprintf(stderr,
                                "gennorm2 error: "
                                "U+%04lX's round-trip mapping's starter "
                                "U+%04lX one-way-decomposes, "
                                "not possible in Unicode normalization\n",
                                (long)start, (long)c);
                        exit(U_INVALID_FORMAT_ERROR);
                    }
                    uint8_t myTrailCC=norms.getCC(m.char32At(i));
                    UChar32 cTrailChar=cNorm.mapping->char32At(cNorm.mapping->length()-1);
                    uint8_t cTrailCC=norms.getCC(cTrailChar);
                    if(cTrailCC>myTrailCC) {
                        fprintf(stderr,
                                "gennorm2 error: "
                                "U+%04lX's round-trip mapping's starter "
                                "U+%04lX decomposes and the "
                                "inner/earlier tccc=%hu > outer/following tccc=%hu, "
                                "not possible in Unicode normalization\n",
                                (long)start, (long)c,
                                (short)cTrailCC, (short)myTrailCC);
                        exit(U_INVALID_FORMAT_ERROR);
                    }
                } else {
                    fprintf(stderr,
                            "gennorm2 error: "
                            "U+%04lX's round-trip mapping's non-starter "
                            "U+%04lX decomposes, "
                            "not possible in Unicode normalization\n",
                            (long)start, (long)c);
                    exit(U_INVALID_FORMAT_ERROR);
                }
            }
            if(decomposed==nullptr) {
                decomposed=new UnicodeString(m, 0, prev);
            }
            decomposed->append(*cNorm.mapping);
        } else if(Hangul::isHangul(c)) {
            UChar buffer[3];
            int32_t hangulLength=Hangul::decompose(c, buffer);
            if(norm.mappingType==Norm::ROUND_TRIP && prev!=0) {
                fprintf(stderr,
                        "gennorm2 error: "
                        "U+%04lX's round-trip mapping's non-starter "
                        "U+%04lX decomposes, "
                        "not possible in Unicode normalization\n",
                        (long)start, (long)c);
                exit(U_INVALID_FORMAT_ERROR);
            }
            if(decomposed==nullptr) {
                decomposed=new UnicodeString(m, 0, prev);
            }
            decomposed->append(buffer, hangulLength);
        } else if(decomposed!=nullptr) {
            decomposed->append(m, prev, i-prev);
        }
    }
    if(decomposed!=nullptr) {
        if(norm.rawMapping==nullptr) {
            // Remember the original mapping when decomposing recursively.
            norm.rawMapping=norm.mapping;
        } else {
            delete norm.mapping;
        }
        norm.mapping=decomposed;
        // Not  norm.setMappingCP();  because the original mapping
        // is most likely to be encodable as a delta.
        didDecompose|=TRUE;
    }
}